

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int64_t expand(archive_read *a,int64_t end)

{
  long lVar1;
  huffman_code *code;
  int iVar2;
  int iVar3;
  rar *rar_00;
  int64_t iVar4;
  long in_RSI;
  rar *in_RDI;
  bool bVar5;
  rar_br *br;
  rar *rar;
  archive_read *in_stack_00000018;
  uchar newfile;
  int lowoffsetsymbol;
  int offssymbol;
  int i;
  int lensymbol;
  int offsindex;
  int len;
  int offs;
  int symbol;
  uint8_t in_stack_ffffffffffffffaf;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_20;
  
  lVar1 = **(long **)((in_RDI->ppmd7_context).See[4] + 10);
  rar_00 = (rar *)(lVar1 + 0x4ec8);
  if (*(long *)(lVar1 + 0x360) < in_RSI) {
    in_RSI = *(long *)(lVar1 + 0x360);
  }
LAB_00150558:
  do {
    while( true ) {
      while( true ) {
        if ((*(char *)(lVar1 + 0x338) != '\0') &&
           (iVar4 = lzss_position((lzss *)(lVar1 + 800)),
           (long)(iVar4 + (ulong)*(uint *)(lVar1 + 0x33c)) <= in_RSI)) {
          lzss_emit_match(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
          *(undefined1 *)(lVar1 + 0x338) = 0;
        }
        if (((*(char *)(lVar1 + 0x36b) != '\0') || (*(char *)(lVar1 + 0x338) != '\0')) ||
           (iVar4 = lzss_position((lzss *)(lVar1 + 800)), in_RSI <= iVar4)) {
          iVar4 = lzss_position((lzss *)(lVar1 + 800));
          return iVar4;
        }
        iVar2 = read_next_symbol((archive_read *)
                                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                 (huffman_code *)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (iVar2 < 0) {
          return -0x1e;
        }
        *(undefined1 *)(lVar1 + 0x338) = 0;
        if (0xff < iVar2) break;
        lzss_emit_literal(rar_00,in_stack_ffffffffffffffaf);
      }
      if (iVar2 != 0x100) break;
      if ((((int)rar_00->file_crc < 1) &&
          (iVar2 = rar_br_fillup((archive_read *)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 (rar_br *)
                                 CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)),
          iVar2 == 0)) && ((int)rar_00->file_crc < 1)) {
LAB_00151006:
        archive_set_error((archive *)in_RDI,0x54,"Truncated RAR file data");
        *(undefined1 *)(lVar1 + 200) = 0;
        return -0x1e;
      }
      bVar5 = (*(ulong *)rar_00 >> ((char)(int)rar_00->file_crc - 1U & 0x3f) & (ulong)1) != 0;
      in_stack_ffffffffffffffc7 = (bVar5 ^ 0xffU) & 1;
      *(int *)&rar_00->file_crc = (int)rar_00->file_crc + -1;
      if (in_stack_ffffffffffffffc7 != 0) {
        *(undefined1 *)(lVar1 + 0xe4) = 1;
        if (((0 < (int)rar_00->file_crc) ||
            (iVar2 = rar_br_fillup((archive_read *)
                                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                   (rar_br *)
                                   ((CONCAT17(bVar5,in_stack_ffffffffffffffc0) ^ 0xff00000000000000)
                                   & 0x1ffffffffffffff)), iVar2 != 0)) ||
           (0 < (int)rar_00->file_crc)) {
          *(byte *)(lVar1 + 0x368) =
               (byte)(*(ulong *)rar_00 >> ((char)(int)rar_00->file_crc - 1U & 0x3f)) & 1;
          *(int *)&rar_00->file_crc = (int)rar_00->file_crc + -1;
          iVar4 = lzss_position((lzss *)(lVar1 + 800));
          return iVar4;
        }
        goto LAB_00151006;
      }
      iVar2 = parse_codes(in_stack_00000018);
      if (iVar2 != 0) {
        return -0x1e;
      }
    }
    if (iVar2 == 0x101) {
      archive_set_error((archive *)in_RDI,-1,"Parsing filters is unsupported.");
      return -0x19;
    }
    if (iVar2 == 0x102) {
      if (*(int *)(lVar1 + 0x33c) == 0) goto LAB_00150558;
      local_20 = *(int *)(lVar1 + 0x340);
      in_stack_ffffffffffffffdc = *(int *)(lVar1 + 0x33c);
    }
    else if (iVar2 < 0x107) {
      iVar2 = iVar2 + -0x103;
      local_20 = *(int *)(lVar1 + 0x344 + (long)iVar2 * 4);
      code = (huffman_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffffd0 = iVar2;
      in_stack_ffffffffffffffd4 =
           read_next_symbol((archive_read *)CONCAT44(in_stack_ffffffffffffffdc,iVar2),code);
      if (((in_stack_ffffffffffffffd4 < 0) || (0x1c < in_stack_ffffffffffffffd4)) ||
         (0x1c < in_stack_ffffffffffffffd4)) goto LAB_00151035;
      in_stack_ffffffffffffffdc = ""[in_stack_ffffffffffffffd4] + 2;
      in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd0;
      if (""[in_stack_ffffffffffffffd4] != '\0') {
        if ((((int)rar_00->file_crc < (int)(uint)""[in_stack_ffffffffffffffd4]) &&
            (iVar2 = rar_br_fillup((archive_read *)
                                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                   (rar_br *)
                                   CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)),
            iVar2 == 0)) && ((int)rar_00->file_crc < (int)(uint)""[in_stack_ffffffffffffffd4]))
        goto LAB_00151006;
        in_stack_ffffffffffffffdc =
             ((uint)(*(ulong *)rar_00 >>
                    ((char)(int)rar_00->file_crc - ""[in_stack_ffffffffffffffd4] & 0x3f)) &
             cache_masks[""[in_stack_ffffffffffffffd4]]) + in_stack_ffffffffffffffdc;
        *(uint *)&rar_00->file_crc = (int)rar_00->file_crc - (uint)""[in_stack_ffffffffffffffd4];
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd0;
      }
      for (; 0 < in_stack_ffffffffffffffd0;
          in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + -1) {
        *(undefined4 *)(lVar1 + 0x344 + (long)in_stack_ffffffffffffffd0 * 4) =
             *(undefined4 *)(lVar1 + 0x344 + (long)(in_stack_ffffffffffffffd0 + -1) * 4);
      }
      *(int *)(lVar1 + 0x344) = local_20;
    }
    else if (iVar2 < 0x10f) {
      local_20 = ""[iVar2 + -0x107] + 1;
      if ("\x02\x02\x03\x04\x05\x06\x06\x06"[iVar2 + -0x107] != '\0') {
        if ((((int)rar_00->file_crc < (int)(uint)"\x02\x02\x03\x04\x05\x06\x06\x06"[iVar2 + -0x107])
            && (iVar3 = rar_br_fillup((archive_read *)
                                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                      (rar_br *)
                                      CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0))
               , iVar3 == 0)) &&
           ((int)rar_00->file_crc < (int)(uint)"\x02\x02\x03\x04\x05\x06\x06\x06"[iVar2 + -0x107]))
        goto LAB_00151006;
        local_20 = ((uint)(*(ulong *)rar_00 >>
                          ((char)(int)rar_00->file_crc -
                           "\x02\x02\x03\x04\x05\x06\x06\x06"[iVar2 + -0x107] & 0x3f)) &
                   cache_masks["\x02\x02\x03\x04\x05\x06\x06\x06"[iVar2 + -0x107]]) + local_20;
        *(uint *)&rar_00->file_crc =
             (int)rar_00->file_crc - (uint)"\x02\x02\x03\x04\x05\x06\x06\x06"[iVar2 + -0x107];
      }
      in_stack_ffffffffffffffdc = 2;
      for (in_stack_ffffffffffffffd0 = 3; 0 < in_stack_ffffffffffffffd0;
          in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + -1) {
        *(undefined4 *)(lVar1 + 0x344 + (long)in_stack_ffffffffffffffd0 * 4) =
             *(undefined4 *)(lVar1 + 0x344 + (long)(in_stack_ffffffffffffffd0 + -1) * 4);
      }
      *(int *)(lVar1 + 0x344) = local_20;
    }
    else {
      if ((0x1c < iVar2 + -0x10f) || (0x1c < iVar2 + -0x10f)) {
LAB_00151035:
        archive_set_error((archive *)in_RDI,0x54,"Bad RAR file data");
        return -0x1e;
      }
      in_stack_ffffffffffffffdc = ""[iVar2 + -0x10f] + 3;
      if (""[iVar2 + -0x10f] != '\0') {
        if ((((int)rar_00->file_crc < (int)(uint)""[iVar2 + -0x10f]) &&
            (iVar3 = rar_br_fillup((archive_read *)
                                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                   (rar_br *)
                                   CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)),
            iVar3 == 0)) && ((int)rar_00->file_crc < (int)(uint)""[iVar2 + -0x10f]))
        goto LAB_00151006;
        in_stack_ffffffffffffffdc =
             ((uint)(*(ulong *)rar_00 >> ((char)(int)rar_00->file_crc - ""[iVar2 + -0x10f] & 0x3f))
             & cache_masks[""[iVar2 + -0x10f]]) + in_stack_ffffffffffffffdc;
        *(uint *)&rar_00->file_crc = (int)rar_00->file_crc - (uint)""[iVar2 + -0x10f];
      }
      in_stack_ffffffffffffffcc =
           read_next_symbol((archive_read *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                            (huffman_code *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if (((in_stack_ffffffffffffffcc < 0) || (0x3c < in_stack_ffffffffffffffcc)) ||
         (0x3c < in_stack_ffffffffffffffcc)) goto LAB_00151035;
      local_20 = expand::offsetbases[in_stack_ffffffffffffffcc] + 1;
      if (""[in_stack_ffffffffffffffcc] != '\0') {
        if (in_stack_ffffffffffffffcc < 10) {
          if ((((int)rar_00->file_crc < (int)(uint)""[in_stack_ffffffffffffffcc]) &&
              (iVar2 = rar_br_fillup((archive_read *)
                                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                     (rar_br *)
                                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)),
              iVar2 == 0)) && ((int)rar_00->file_crc < (int)(uint)""[in_stack_ffffffffffffffcc]))
          goto LAB_00151006;
          local_20 = ((uint)(*(ulong *)rar_00 >>
                            ((char)(int)rar_00->file_crc - ""[in_stack_ffffffffffffffcc] & 0x3f)) &
                     cache_masks[""[in_stack_ffffffffffffffcc]]) + local_20;
          *(uint *)&rar_00->file_crc = (int)rar_00->file_crc - (uint)""[in_stack_ffffffffffffffcc];
        }
        else {
          if (4 < ""[in_stack_ffffffffffffffcc]) {
            if ((((int)rar_00->file_crc < (int)(""[in_stack_ffffffffffffffcc] - 4)) &&
                (iVar2 = rar_br_fillup((archive_read *)
                                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                                       ,(rar_br *)
                                        CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0
                                                )), iVar2 == 0)) &&
               ((int)rar_00->file_crc < (int)(""[in_stack_ffffffffffffffcc] - 4)))
            goto LAB_00151006;
            local_20 = ((uint)(*(ulong *)rar_00 >>
                              ((char)(int)rar_00->file_crc - (""[in_stack_ffffffffffffffcc] + 0xfc)
                              & 0x3f)) & cache_masks[(int)(""[in_stack_ffffffffffffffcc] - 4)]) *
                       0x10 + local_20;
            *(uint *)&rar_00->file_crc = (int)rar_00->file_crc - (""[in_stack_ffffffffffffffcc] - 4)
            ;
          }
          if (*(int *)(lVar1 + 0x358) == 0) {
            in_stack_ffffffffffffffc8 =
                 read_next_symbol((archive_read *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                  (huffman_code *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
            if (in_stack_ffffffffffffffc8 < 0) {
              return -0x1e;
            }
            if (in_stack_ffffffffffffffc8 == 0x10) {
              *(undefined4 *)(lVar1 + 0x358) = 0xf;
              iVar2 = *(int *)(lVar1 + 0x354);
            }
            else {
              *(int *)(lVar1 + 0x354) = in_stack_ffffffffffffffc8;
              iVar2 = in_stack_ffffffffffffffc8;
            }
          }
          else {
            *(int *)(lVar1 + 0x358) = *(int *)(lVar1 + 0x358) + -1;
            iVar2 = *(int *)(lVar1 + 0x354);
          }
          local_20 = iVar2 + local_20;
        }
      }
      if (0x3ffff < local_20) {
        in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1;
      }
      if (0x1fff < local_20) {
        in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1;
      }
      for (in_stack_ffffffffffffffd0 = 3; 0 < in_stack_ffffffffffffffd0;
          in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + -1) {
        *(undefined4 *)(lVar1 + 0x344 + (long)in_stack_ffffffffffffffd0 * 4) =
             *(undefined4 *)(lVar1 + 0x344 + (long)(in_stack_ffffffffffffffd0 + -1) * 4);
      }
      *(int *)(lVar1 + 0x344) = local_20;
    }
    *(int *)(lVar1 + 0x340) = local_20;
    *(int *)(lVar1 + 0x33c) = in_stack_ffffffffffffffdc;
    *(undefined1 *)(lVar1 + 0x338) = 1;
  } while( true );
}

Assistant:

static int64_t
expand(struct archive_read *a, int64_t end)
{
  static const unsigned char lengthbases[] =
    {   0,   1,   2,   3,   4,   5,   6,
        7,   8,  10,  12,  14,  16,  20,
       24,  28,  32,  40,  48,  56,  64,
       80,  96, 112, 128, 160, 192, 224 };
  static const unsigned char lengthbits[] =
    { 0, 0, 0, 0, 0, 0, 0,
      0, 1, 1, 1, 1, 2, 2,
      2, 2, 3, 3, 3, 3, 4,
      4, 4, 4, 5, 5, 5, 5 };
  static const unsigned int offsetbases[] =
    {       0,       1,       2,       3,       4,       6,
            8,      12,      16,      24,      32,      48,
           64,      96,     128,     192,     256,     384,
          512,     768,    1024,    1536,    2048,    3072,
         4096,    6144,    8192,   12288,   16384,   24576,
        32768,   49152,   65536,   98304,  131072,  196608,
       262144,  327680,  393216,  458752,  524288,  589824,
       655360,  720896,  786432,  851968,  917504,  983040,
      1048576, 1310720, 1572864, 1835008, 2097152, 2359296,
      2621440, 2883584, 3145728, 3407872, 3670016, 3932160 };
  static const unsigned char offsetbits[] =
    {  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,
       5,  5,  6,  6,  7,  7,  8,  8,  9,  9, 10, 10,
      11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
      18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18 };
  static const unsigned char shortbases[] =
    { 0, 4, 8, 16, 32, 64, 128, 192 };
  static const unsigned char shortbits[] =
    { 2, 2, 3, 4, 5, 6, 6, 6 };

  int symbol, offs, len, offsindex, lensymbol, i, offssymbol, lowoffsetsymbol;
  unsigned char newfile;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  if (rar->filterstart < end)
    end = rar->filterstart;

  while (1)
  {
    if (rar->output_last_match &&
      lzss_position(&rar->lzss) + rar->lastlength <= end)
    {
      lzss_emit_match(rar, rar->lastoffset, rar->lastlength);
      rar->output_last_match = 0;
    }

    if(rar->is_ppmd_block || rar->output_last_match ||
      lzss_position(&rar->lzss) >= end)
      return lzss_position(&rar->lzss);

    if ((symbol = read_next_symbol(a, &rar->maincode)) < 0)
      return (ARCHIVE_FATAL);
    rar->output_last_match = 0;

    if (symbol < 256)
    {
      lzss_emit_literal(rar, symbol);
      continue;
    }
    else if (symbol == 256)
    {
      if (!rar_br_read_ahead(a, br, 1))
        goto truncated_data;
      newfile = !rar_br_bits(br, 1);
      rar_br_consume(br, 1);

      if(newfile)
      {
        rar->start_new_block = 1;
        if (!rar_br_read_ahead(a, br, 1))
          goto truncated_data;
        rar->start_new_table = rar_br_bits(br, 1);
        rar_br_consume(br, 1);
        return lzss_position(&rar->lzss);
      }
      else
      {
        if (parse_codes(a) != ARCHIVE_OK)
          return (ARCHIVE_FATAL);
        continue;
      }
    }
    else if(symbol==257)
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                        "Parsing filters is unsupported.");
      return (ARCHIVE_FAILED);
    }
    else if(symbol==258)
    {
      if(rar->lastlength == 0)
        continue;

      offs = rar->lastoffset;
      len = rar->lastlength;
    }
    else if (symbol <= 262)
    {
      offsindex = symbol - 259;
      offs = rar->oldoffset[offsindex];

      if ((lensymbol = read_next_symbol(a, &rar->lengthcode)) < 0)
        goto bad_data;
      if (lensymbol > (int)(sizeof(lengthbases)/sizeof(lengthbases[0])))
        goto bad_data;
      if (lensymbol > (int)(sizeof(lengthbits)/sizeof(lengthbits[0])))
        goto bad_data;
      len = lengthbases[lensymbol] + 2;
      if (lengthbits[lensymbol] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[lensymbol]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[lensymbol]);
        rar_br_consume(br, lengthbits[lensymbol]);
      }

      for (i = offsindex; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else if(symbol<=270)
    {
      offs = shortbases[symbol-263] + 1;
      if(shortbits[symbol-263] > 0) {
        if (!rar_br_read_ahead(a, br, shortbits[symbol-263]))
          goto truncated_data;
        offs += rar_br_bits(br, shortbits[symbol-263]);
        rar_br_consume(br, shortbits[symbol-263]);
      }

      len = 2;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else
    {
      if (symbol-271 > (int)(sizeof(lengthbases)/sizeof(lengthbases[0])))
        goto bad_data;
      if (symbol-271 > (int)(sizeof(lengthbits)/sizeof(lengthbits[0])))
        goto bad_data;
      len = lengthbases[symbol-271]+3;
      if(lengthbits[symbol-271] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[symbol-271]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[symbol-271]);
        rar_br_consume(br, lengthbits[symbol-271]);
      }

      if ((offssymbol = read_next_symbol(a, &rar->offsetcode)) < 0)
        goto bad_data;
      if (offssymbol > (int)(sizeof(offsetbases)/sizeof(offsetbases[0])))
        goto bad_data;
      if (offssymbol > (int)(sizeof(offsetbits)/sizeof(offsetbits[0])))
        goto bad_data;
      offs = offsetbases[offssymbol]+1;
      if(offsetbits[offssymbol] > 0)
      {
        if(offssymbol > 9)
        {
          if(offsetbits[offssymbol] > 4) {
            if (!rar_br_read_ahead(a, br, offsetbits[offssymbol] - 4))
              goto truncated_data;
            offs += rar_br_bits(br, offsetbits[offssymbol] - 4) << 4;
            rar_br_consume(br, offsetbits[offssymbol] - 4);
	  }

          if(rar->numlowoffsetrepeats > 0)
          {
            rar->numlowoffsetrepeats--;
            offs += rar->lastlowoffset;
          }
          else
          {
            if ((lowoffsetsymbol =
              read_next_symbol(a, &rar->lowoffsetcode)) < 0)
              return (ARCHIVE_FATAL);
            if(lowoffsetsymbol == 16)
            {
              rar->numlowoffsetrepeats = 15;
              offs += rar->lastlowoffset;
            }
            else
            {
              offs += lowoffsetsymbol;
              rar->lastlowoffset = lowoffsetsymbol;
            }
          }
        }
        else {
          if (!rar_br_read_ahead(a, br, offsetbits[offssymbol]))
            goto truncated_data;
          offs += rar_br_bits(br, offsetbits[offssymbol]);
          rar_br_consume(br, offsetbits[offssymbol]);
        }
      }

      if (offs >= 0x40000)
        len++;
      if (offs >= 0x2000)
        len++;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }

    rar->lastoffset = offs;
    rar->lastlength = len;
    rar->output_last_match = 1;
  }
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
bad_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}